

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week9-hw.cpp
# Opt level: O3

int main(int param_1,char **param_2)

{
  pointer pcVar1;
  pointer pSVar2;
  bool bVar3;
  ostream *poVar4;
  Student *item;
  pointer pCVar5;
  pointer pSVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  vector<Student,_std::allocator<Student>_> local_98;
  undefined1 local_78 [40];
  pointer local_50;
  Students local_48;
  
  local_50 = courses.super__Vector_base<Course,_std::allocator<Course>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (courses.super__Vector_base<Course,_std::allocator<Course>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      courses.super__Vector_base<Course,_std::allocator<Course>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    pCVar5 = courses.super__Vector_base<Course,_std::allocator<Course>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Course Code is ",0xf);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(pCVar5->code)._M_dataplus._M_p,
                          (pCVar5->code)._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      pSVar2 = students.super__Vector_base<Student,_std::allocator<Student>_>._M_impl.
               super__Vector_impl_data._M_finish;
      uVar7 = 0;
      uVar8 = 0;
      uVar9 = 0;
      uVar10 = 0;
      local_98.super__Vector_base<Student,_std::allocator<Student>_>._M_impl.super__Vector_impl_data
      ._M_start = (pointer)0x0;
      local_98.super__Vector_base<Student,_std::allocator<Student>_>._M_impl.super__Vector_impl_data
      ._M_finish = (pointer)0x0;
      local_98.super__Vector_base<Student,_std::allocator<Student>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage = (pointer)0x0;
      pSVar6 = students.super__Vector_base<Student,_std::allocator<Student>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (students.super__Vector_base<Student,_std::allocator<Student>_>._M_impl.
          super__Vector_impl_data._M_start ==
          students.super__Vector_base<Student,_std::allocator<Student>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        local_48.super__Vector_base<Student,_std::allocator<Student>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      }
      else {
        do {
          pcVar1 = (pCVar5->code)._M_dataplus._M_p;
          local_78._0_8_ = (pointer)(local_78 + 0x10);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_78,pcVar1,pcVar1 + (pCVar5->code)._M_string_length);
          bVar3 = contains<std::vector<CourseGrade,std::allocator<CourseGrade>>,Student::has_taken_course(std::__cxx11::string)const::_lambda(CourseGrade_const&)_1_>
                            (&pSVar6->course_grades,(CourseCode *)local_78);
          if ((pointer)local_78._0_8_ != (pointer)(local_78 + 0x10)) {
            operator_delete((void *)local_78._0_8_,
                            (ulong)((long)&(((string *)local_78._16_8_)->_M_dataplus)._M_p + 1));
          }
          if (bVar3) {
            std::vector<Student,_std::allocator<Student>_>::push_back(&local_98,pSVar6);
          }
          pSVar6 = pSVar6 + 1;
        } while (pSVar6 != pSVar2);
        local_48.super__Vector_base<Student,_std::allocator<Student>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_98.super__Vector_base<Student,_std::allocator<Student>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        uVar7 = local_98.super__Vector_base<Student,_std::allocator<Student>_>._M_impl.
                super__Vector_impl_data._M_start._0_4_;
        uVar8 = local_98.super__Vector_base<Student,_std::allocator<Student>_>._M_impl.
                super__Vector_impl_data._M_start._4_4_;
        uVar9 = local_98.super__Vector_base<Student,_std::allocator<Student>_>._M_impl.
                super__Vector_impl_data._M_finish._0_4_;
        uVar10 = local_98.super__Vector_base<Student,_std::allocator<Student>_>._M_impl.
                 super__Vector_impl_data._M_finish._4_4_;
      }
      local_98.super__Vector_base<Student,_std::allocator<Student>_>._M_impl.super__Vector_impl_data
      ._M_start = (pointer)0x0;
      local_98.super__Vector_base<Student,_std::allocator<Student>_>._M_impl.super__Vector_impl_data
      ._M_finish = (pointer)0x0;
      local_98.super__Vector_base<Student,_std::allocator<Student>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage = (pointer)0x0;
      local_48.super__Vector_base<Student,_std::allocator<Student>_>._M_impl.super__Vector_impl_data
      ._M_start._0_4_ = uVar7;
      local_48.super__Vector_base<Student,_std::allocator<Student>_>._M_impl.super__Vector_impl_data
      ._M_start._4_4_ = uVar8;
      local_48.super__Vector_base<Student,_std::allocator<Student>_>._M_impl.super__Vector_impl_data
      ._M_finish._0_4_ = uVar9;
      local_48.super__Vector_base<Student,_std::allocator<Student>_>._M_impl.super__Vector_impl_data
      ._M_finish._4_4_ = uVar10;
      std::vector<Student,_std::allocator<Student>_>::~vector(&local_98);
      print(&local_48);
      std::vector<Student,_std::allocator<Student>_>::~vector(&local_48);
      pCVar5 = pCVar5 + 1;
    } while (pCVar5 != local_50);
  }
  pSVar2 = students.super__Vector_base<Student,_std::allocator<Student>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_78._0_4_ = 0;
  local_78._4_4_ = 0;
  local_78._8_4_ = 0;
  local_78._12_4_ = 0;
  local_78._0_8_ = (pointer)0x0;
  local_78._8_8_ = (pointer)0x0;
  local_78._16_8_ = (pointer)0x0;
  if (students.super__Vector_base<Student,_std::allocator<Student>_>._M_impl.super__Vector_impl_data
      ._M_start ==
      students.super__Vector_base<Student,_std::allocator<Student>_>._M_impl.super__Vector_impl_data
      ._M_finish) {
    local_98.super__Vector_base<Student,_std::allocator<Student>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
  }
  else {
    pSVar6 = students.super__Vector_base<Student,_std::allocator<Student>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      if (2 < (ulong)(((long)(pSVar6->course_grades).
                             super__Vector_base<CourseGrade,_std::allocator<CourseGrade>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)(pSVar6->course_grades).
                             super__Vector_base<CourseGrade,_std::allocator<CourseGrade>_>._M_impl.
                             super__Vector_impl_data._M_start >> 3) * -0x3333333333333333)) {
        std::vector<Student,_std::allocator<Student>_>::push_back
                  ((vector<Student,_std::allocator<Student>_> *)local_78,pSVar6);
      }
      pSVar6 = pSVar6 + 1;
    } while (pSVar6 != pSVar2);
    local_98.super__Vector_base<Student,_std::allocator<Student>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)local_78._16_8_;
  }
  local_98.super__Vector_base<Student,_std::allocator<Student>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT44(local_78._4_4_,local_78._0_4_);
  local_98.super__Vector_base<Student,_std::allocator<Student>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)CONCAT44(local_78._12_4_,local_78._8_4_);
  local_78._0_8_ = (pointer)0x0;
  local_78._8_8_ = (pointer)0x0;
  local_78._16_8_ = (pointer)0x0;
  std::vector<Student,_std::allocator<Student>_>::~vector
            ((vector<Student,_std::allocator<Student>_> *)local_78);
  print(&local_98);
  std::vector<Student,_std::allocator<Student>_>::~vector(&local_98);
  return 0;
}

Assistant:

int main(int, char*[])
{
    // use filter algorithm on students for filtering the students
    // who has taken CS401 course before, then write the names of the students with print(v1)
    for(const auto& course : courses)
    {
        cout << "Course Code is " << course.code << endl;
        auto v1 = filter(students, [&](const Student& s) {
            return s.has_taken_course(course.code);
        });
        print(v1);
    }

    // use filter algorithm on students for filtering the students
    // who has taken at least 3 courses before, then write the names of the students with print(v2)
    auto v2 = filter(students, [](const Student& s) {
        return s.num_taken_courses() >= 3;
    });
    print(v2);

    return 0;
}